

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::Path::parse(Path *__return_storage_ptr__,Path *this,StringPtr path)

{
  Fault firstElement;
  char *pcVar1;
  Exception *pEVar2;
  char *pcVar3;
  size_t sVar4;
  size_t capacity;
  StringPtr path_00;
  DebugExpression<bool> _kjCondition;
  StringPtr path_local;
  Fault f;
  
  path_local.content.size_ = (size_t)path.content.ptr;
  capacity = 1;
  path_local.content.ptr = (char *)this;
  if ((char *)path_local.content.size_ == (char *)0x1) {
    pcVar3 = (char *)0x1;
  }
  else {
    _kjCondition.value = *(char *)&(this->parts).ptr != '/';
    pcVar3 = (char *)path_local.content.size_;
    if (!_kjCondition.value) {
      _::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[39],kj::StringPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x39,FAILED,"!path.startsWith(\"/\")",
                 "_kjCondition,\"expected a relative path, got absolute\", path",&_kjCondition,
                 (char (*) [39])"expected a relative path, got absolute",&path_local);
      _::Debug::Fault::~Fault(&f);
      pcVar3 = (char *)path_local.content.size_;
    }
  }
  if (path_local.content.ptr + (long)pcVar3 + -1 != path_local.content.ptr) {
    capacity = 1;
    pcVar1 = (char *)0x0;
    do {
      capacity = capacity + (path_local.content.ptr[(long)pcVar1] == '/');
      pcVar1 = pcVar1 + 1;
    } while (pcVar3 + -1 != pcVar1);
  }
  sVar4 = 0;
  pEVar2 = (Exception *)
           _::HeapArrayDisposer::allocateImpl
                     (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  path_00.content.size_ = sVar4;
  path_00.content.ptr = (char *)path_local.content.size_;
  f.exception = pEVar2;
  evalImpl(__return_storage_ptr__,(Path *)&f,(Vector<kj::String> *)path_local.content.ptr,path_00);
  firstElement.exception = f.exception;
  if (f.exception != (Exception *)0x0) {
    f.exception = (Exception *)0x0;
    _::HeapArrayDisposer::disposeImpl
              ((HeapArrayDisposer *)&_::HeapArrayDisposer::instance,firstElement.exception,0x18,
               ((long)pEVar2 - (long)firstElement.exception >> 3) * -0x5555555555555555,
               ((long)((long)pEVar2 + (capacity * 0x18 - (long)firstElement.exception)) >> 3) *
               -0x5555555555555555,ArrayDisposer::Dispose_<kj::String>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

Path Path::parse(StringPtr path) {
  KJ_REQUIRE(!path.startsWith("/"), "expected a relative path, got absolute", path) {
    // When exceptions are disabled, go on -- the leading '/' will end up ignored.
    break;
  }
  return evalImpl(Vector<String>(countParts(path)), path);
}